

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O1

void add_csc_range_penalty<PredictionData<double,int>>
               (WorkerForPredictCSC *workspace,PredictionData<double,_int> *prediction_data,
               double *weights_arr,size_t col_num,double range_low,double range_high)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  pointer puVar4;
  ulong uVar5;
  double *pdVar6;
  pointer pdVar7;
  unsigned_long uVar8;
  ulong uVar9;
  long lVar10;
  ulong *puVar11;
  pointer puVar12;
  ulong uVar13;
  ulong *puVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  size_t row;
  int *piVar18;
  double dVar19;
  
  puVar12 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar4 = puVar12 + workspace->st;
  puVar12 = puVar12 + workspace->end + 1;
  if (puVar4 != puVar12) {
    uVar9 = (long)puVar12 - (long)puVar4 >> 3;
    lVar10 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar4,puVar12,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar4,puVar12);
  }
  piVar3 = prediction_data->Xc_ind;
  lVar17 = (long)prediction_data->Xc_indptr[col_num];
  lVar10 = (long)prediction_data->Xc_indptr[col_num + 1];
  puVar4 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar9 = workspace->st;
  puVar11 = puVar4 + uVar9;
  uVar5 = workspace->end;
  puVar14 = puVar4 + uVar5 + 1;
  uVar15 = (long)puVar14 - (long)puVar11 >> 3;
  if (0 < (long)uVar15) {
    do {
      uVar16 = uVar15 >> 1;
      uVar13 = ~uVar16 + uVar15;
      uVar15 = uVar16;
      if (puVar11[uVar16] < (ulong)(long)piVar3[lVar17]) {
        puVar11 = puVar11 + uVar16 + 1;
        uVar15 = uVar13;
      }
    } while (0 < (long)uVar15);
  }
  iVar1 = piVar3[lVar10 + -1];
  if ((0.0 < range_low) || (range_high < 0.0)) {
    if (weights_arr == (double *)0x0) {
      if (uVar9 <= uVar5) {
        pdVar7 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          pdVar7[puVar4[uVar9]] = pdVar7[puVar4[uVar9]] + -1.0;
          uVar9 = uVar9 + 1;
        } while (uVar9 <= uVar5);
      }
    }
    else if (uVar9 <= uVar5) {
      pdVar7 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        uVar8 = puVar4[uVar9];
        pdVar7[uVar8] = pdVar7[uVar8] - weights_arr[uVar8];
        uVar9 = uVar9 + 1;
      } while (uVar9 <= uVar5);
    }
    if ((puVar11 != puVar14) && (lVar10 != lVar17)) {
      pdVar6 = prediction_data->Xc;
      pdVar7 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      while (*puVar11 <= (ulong)(long)iVar1) {
        piVar18 = piVar3 + lVar17;
        iVar2 = *piVar18;
        if (iVar2 == (int)*puVar11) {
          dVar19 = pdVar6[lVar17];
          if ((NAN(dVar19)) || ((range_low <= dVar19 && (dVar19 <= range_high)))) {
            dVar19 = 1.0;
            if (weights_arr != (double *)0x0) {
              dVar19 = weights_arr[*puVar11];
            }
            pdVar7[*puVar11] = dVar19 + pdVar7[*puVar11];
          }
          if (puVar11 == puVar4 + uVar5) {
            return;
          }
          if (lVar17 == lVar10 + -1) {
            return;
          }
          piVar18 = piVar18 + 1;
          puVar11 = puVar11 + 1;
          uVar9 = (long)piVar3 + (lVar10 * 4 - (long)piVar18) >> 2;
          if (0 < (long)uVar9) {
            do {
              uVar13 = uVar9 >> 1;
              uVar15 = ~uVar13 + uVar9;
              uVar9 = uVar13;
              if ((ulong)(long)piVar18[uVar13] < *puVar11) {
                piVar18 = piVar18 + uVar13 + 1;
                uVar9 = uVar15;
              }
            } while (0 < (long)uVar9);
          }
LAB_001cbbb1:
          lVar17 = (long)piVar18 - (long)piVar3 >> 2;
        }
        else {
          if (iVar2 <= (int)*puVar11) {
            piVar18 = piVar18 + 1;
            uVar9 = (long)piVar3 + (lVar10 * 4 - (long)piVar18) >> 2;
            if (0 < (long)uVar9) {
              do {
                uVar13 = uVar9 >> 1;
                uVar15 = ~uVar13 + uVar9;
                uVar9 = uVar13;
                if ((ulong)(long)piVar18[uVar13] < *puVar11) {
                  piVar18 = piVar18 + uVar13 + 1;
                  uVar9 = uVar15;
                }
              } while (0 < (long)uVar9);
            }
            goto LAB_001cbbb1;
          }
          puVar11 = puVar11 + 1;
          uVar9 = (long)puVar14 - (long)puVar11 >> 3;
          while (0 < (long)uVar9) {
            uVar15 = uVar9 >> 1;
            uVar13 = ~uVar15 + uVar9;
            uVar9 = uVar15;
            if (puVar11[uVar15] < (ulong)(long)iVar2) {
              puVar11 = puVar11 + uVar15 + 1;
              uVar9 = uVar13;
            }
          }
        }
        if (puVar11 == puVar14) {
          return;
        }
        if (lVar17 == lVar10) {
          return;
        }
      }
    }
  }
  else if ((puVar11 != puVar14) && (lVar10 != lVar17)) {
    pdVar6 = prediction_data->Xc;
    pdVar7 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    while (*puVar11 <= (ulong)(long)iVar1) {
      piVar18 = piVar3 + lVar17;
      iVar2 = *piVar18;
      if (iVar2 == (int)*puVar11) {
        dVar19 = pdVar6[lVar17];
        if ((!NAN(dVar19)) && ((dVar19 < range_low || (range_high < dVar19)))) {
          dVar19 = 1.0;
          if (weights_arr != (double *)0x0) {
            dVar19 = weights_arr[*puVar11];
          }
          pdVar7[*puVar11] = pdVar7[*puVar11] - dVar19;
        }
        if (puVar11 == puVar4 + uVar5) {
          return;
        }
        if (lVar17 == lVar10 + -1) {
          return;
        }
        piVar18 = piVar18 + 1;
        puVar11 = puVar11 + 1;
        uVar9 = (long)piVar3 + (lVar10 * 4 - (long)piVar18) >> 2;
        if (0 < (long)uVar9) {
          do {
            uVar13 = uVar9 >> 1;
            uVar15 = ~uVar13 + uVar9;
            uVar9 = uVar13;
            if ((ulong)(long)piVar18[uVar13] < *puVar11) {
              piVar18 = piVar18 + uVar13 + 1;
              uVar9 = uVar15;
            }
          } while (0 < (long)uVar9);
        }
LAB_001cb9dc:
        lVar17 = (long)piVar18 - (long)piVar3 >> 2;
      }
      else {
        if (iVar2 <= (int)*puVar11) {
          piVar18 = piVar18 + 1;
          uVar9 = (long)piVar3 + (lVar10 * 4 - (long)piVar18) >> 2;
          if (0 < (long)uVar9) {
            do {
              uVar13 = uVar9 >> 1;
              uVar15 = ~uVar13 + uVar9;
              uVar9 = uVar13;
              if ((ulong)(long)piVar18[uVar13] < *puVar11) {
                piVar18 = piVar18 + uVar13 + 1;
                uVar9 = uVar15;
              }
            } while (0 < (long)uVar9);
          }
          goto LAB_001cb9dc;
        }
        puVar11 = puVar11 + 1;
        uVar9 = (long)puVar14 - (long)puVar11 >> 3;
        while (0 < (long)uVar9) {
          uVar15 = uVar9 >> 1;
          uVar13 = ~uVar15 + uVar9;
          uVar9 = uVar15;
          if (puVar11[uVar15] < (ulong)(long)iVar2) {
            puVar11 = puVar11 + uVar15 + 1;
            uVar9 = uVar13;
          }
        }
      }
      if (puVar11 == puVar14) {
        return;
      }
      if (lVar17 == lVar10) {
        return;
      }
    }
  }
  return;
}

Assistant:

void add_csc_range_penalty(WorkerForPredictCSC     &workspace,
                           const PredictionData    &prediction_data,
                           const double *restrict  weights_arr,
                           size_t                  col_num,
                           double                  range_low,
                           double                  range_high)
{
    std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);

    size_t st_col  = prediction_data.Xc_indptr[col_num];
    size_t end_col = prediction_data.Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = prediction_data.Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(workspace.ix_arr.data() + workspace.st,
                                      workspace.ix_arr.data() + workspace.end + 1,
                                      prediction_data.Xc_ind[st_col]);

    if (range_low <= 0 && range_high >= 0)
    {
        for (size_t *row = ptr_st;
             row != workspace.ix_arr.data() + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (prediction_data.Xc_ind[curr_pos] == (decltype(*prediction_data.Xc_ind))(*row))
            {
                if (likely(!std::isnan(prediction_data.Xc[curr_pos])
                               &&
                           (   prediction_data.Xc[curr_pos] < range_low    ||
                               prediction_data.Xc[curr_pos] > range_high   )))
                {
                    workspace.depths[*row] -= (weights_arr == NULL)? 1. : weights_arr[*row];
                }
                
                if (row == workspace.ix_arr.data() + workspace.end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                            prediction_data.Xc_ind + end_col  + 1,
                                            *(++row))
                                - prediction_data.Xc_ind;
            }

            else
            {
                if (prediction_data.Xc_ind[curr_pos] > (decltype(*prediction_data.Xc_ind))(*row))
                    row = std::lower_bound(row + 1,
                                           workspace.ix_arr.data() + workspace.end + 1,
                                           prediction_data.Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                                prediction_data.Xc_ind + end_col  + 1,
                                                *row)
                                    - prediction_data.Xc_ind;
            }
        }
    }

    else
    {
        if (likely(weights_arr == NULL))
            for (size_t row = workspace.st; row <= workspace.end; row++)
                workspace.depths[workspace.ix_arr[row]]--;
        else
            for (size_t row = workspace.st; row <= workspace.end; row++)
                workspace.depths[workspace.ix_arr[row]] -= weights_arr[workspace.ix_arr[row]];


        for (size_t *row = ptr_st;
             row != workspace.ix_arr.data() + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (prediction_data.Xc_ind[curr_pos] == (decltype(*prediction_data.Xc_ind))(*row))
            {
                if (likely(std::isnan(prediction_data.Xc[curr_pos])
                               ||
                           (   prediction_data.Xc[curr_pos] >= range_low    &&
                               prediction_data.Xc[curr_pos] <= range_high   )))
                {
                    workspace.depths[*row] += (weights_arr == NULL)? 1. : weights_arr[*row];
                }
                
                if (row == workspace.ix_arr.data() + workspace.end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                            prediction_data.Xc_ind + end_col  + 1,
                                            *(++row))
                                - prediction_data.Xc_ind;
            }

            else
            {
                if (prediction_data.Xc_ind[curr_pos] > (decltype(*prediction_data.Xc_ind))(*row))
                    row = std::lower_bound(row + 1,
                                           workspace.ix_arr.data() + workspace.end + 1,
                                           prediction_data.Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                                prediction_data.Xc_ind + end_col  + 1,
                                                *row)
                                    - prediction_data.Xc_ind;
            }
        }
    }
}